

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O1

optional<QByteArray> *
qEnvironmentVariableOptionalByteArray(optional<QByteArray> *__return_storage_ptr__,char *name)

{
  QArrayData *pQVar1;
  char *pcVar2;
  undefined1 *puVar3;
  char *__old_val;
  long in_FS_OFFSET;
  bool bVar4;
  QArrayData *local_38;
  char *pcStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_38);
  puVar3 = local_28;
  pcVar2 = pcStack_30;
  pQVar1 = local_38;
  bVar4 = pcStack_30 != (char *)0x0;
  if (bVar4) {
    local_38 = (QArrayData *)0x0;
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_payload._M_value.d.d = (Data *)pQVar1;
    pcStack_30 = (char *)0x0;
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_payload._M_value.d.ptr = pcVar2;
    local_28 = (undefined1 *)0x0;
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_payload._M_value.d.size = (qsizetype)puVar3;
  }
  (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
  super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>.
  _M_engaged = bVar4;
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional<QByteArray> qEnvironmentVariableOptionalByteArray(const char *name)
{
    QByteArray value = qgetenv(name);
    return value.isNull() ? std::nullopt : std::optional(std::move(value));
}